

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<double,duckdb::string_t>,double,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  AggregateBinaryInput *binary;
  ulong uVar1;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  anon_union_16_2_67f50693_for_value local_e8;
  long *local_d8;
  ulong local_d0;
  ulong local_c8;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  binary = (AggregateBinaryInput *)count;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  local_e8.pointer.ptr = (char *)local_68;
  local_d8 = local_b0;
  local_e8._0_8_ = aggr_input_data;
  if (local_b0[0] == 0 && local_68[0] == 0) {
    if (count != 0) {
      uVar1 = 0;
      do {
        local_d0 = uVar1;
        if (*local_78 != 0) {
          local_d0 = (ulong)*(uint *)(*local_78 + uVar1 * 4);
        }
        local_c8 = uVar1;
        if (*local_c0 != 0) {
          local_c8 = (ulong)*(uint *)(*local_c0 + uVar1 * 4);
        }
        ArgMinMaxBase<duckdb::LessThan,true>::
        Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                  ((ArgMinMaxBase<duckdb::LessThan,true> *)state,
                   (ArgMinMaxState<double,_duckdb::string_t> *)(local_d0 * 8 + local_70),
                   (double *)(local_c8 * 0x10 + local_b8),(string_t *)&local_e8.pointer,binary);
        uVar1 = uVar1 + 1;
      } while (count != uVar1);
    }
  }
  else if (count != 0) {
    uVar1 = 0;
    do {
      local_d0 = uVar1;
      if (*local_78 != 0) {
        local_d0 = (ulong)*(uint *)(*local_78 + uVar1 * 4);
      }
      local_c8 = uVar1;
      if (*local_c0 != 0) {
        local_c8 = (ulong)*(uint *)(*local_c0 + uVar1 * 4);
      }
      if (((local_68[0] == 0) ||
          ((*(ulong *)(local_68[0] + (local_d0 >> 6) * 8) >> (local_d0 & 0x3f) & 1) != 0)) &&
         ((local_b0[0] == 0 ||
          ((*(ulong *)(local_b0[0] + (local_c8 >> 6) * 8) >> (local_c8 & 0x3f) & 1) != 0)))) {
        ArgMinMaxBase<duckdb::LessThan,true>::
        Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                  ((ArgMinMaxBase<duckdb::LessThan,true> *)state,
                   (ArgMinMaxState<double,_duckdb::string_t> *)(local_d0 * 8 + local_70),
                   (double *)(local_c8 * 0x10 + local_b8),(string_t *)&local_e8.pointer,binary);
      }
      uVar1 = uVar1 + 1;
    } while (count != uVar1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}